

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::resetAssertionInfo(RunContext *this)

{
  StringRef *in_RDI;
  StringRef *in_stack_ffffffffffffffc8;
  StringRef *in_stack_ffffffffffffffd0;
  
  StringRef::StringRef((StringRef *)0x12747d);
  StringRef::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  StringRef::~StringRef(in_RDI);
  operator____sr((char *)in_stack_ffffffffffffffc8,(size_t)in_RDI);
  StringRef::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  StringRef::~StringRef(in_RDI);
  return;
}

Assistant:

void RunContext::resetAssertionInfo() {
        m_lastAssertionInfo.macroName = StringRef();
        m_lastAssertionInfo.capturedExpression = "{Unknown expression after the reported line}"_sr;
    }